

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

void __thiscall
cmQtAutoGenInitializer::AddGeneratedSource
          (cmQtAutoGenInitializer *this,ConfigString *filename,GenVarsT *genVars,bool prepend)

{
  pointer pbVar1;
  cmGeneratorTarget *this_00;
  int iVar2;
  cmSourceFile *pcVar3;
  const_iterator cVar4;
  pointer __k;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  size_type local_70;
  pointer local_68;
  undefined8 local_60;
  char *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  char *local_38;
  
  if (this->MultiConfig == true) {
    iVar2 = (*this->GlobalGen->_vptr_cmGlobalGenerator[0x27])();
    if ((char)iVar2 == '\0') {
      __k = (this->ConfigsList).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (this->ConfigsList).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__k != pbVar1) {
        do {
          cVar4 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&(filename->Config)._M_h,__k);
          if (cVar4.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::__throw_out_of_range("_Map_base::at");
          }
          pcVar3 = RegisterGeneratedSource
                             (this,(string *)
                                   ((long)cVar4.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                          ._M_cur + 0x28));
          handleSkipPch(this,pcVar3);
          this_00 = this->GenTarget;
          local_68 = (__k->_M_dataplus)._M_p;
          local_70 = __k->_M_string_length;
          local_80._M_len = 0xb;
          local_80._M_str = "$<$<CONFIG:";
          local_60 = 2;
          local_58 = ">:";
          local_48 = *(undefined8 *)
                      ((long)cVar4.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                             ._M_cur + 0x28);
          local_50 = *(undefined8 *)
                      ((long)cVar4.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                             ._M_cur + 0x30);
          local_40 = 1;
          local_38 = ">";
          views._M_len = 5;
          views._M_array = &local_80;
          cmCatViews_abi_cxx11_(&local_a0,views);
          cmGeneratorTarget::AddSource(this_00,&local_a0,prepend);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          AddToSourceGroup(this,(string *)
                                ((long)cVar4.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                       ._M_cur + 0x28),genVars->GenNameUpper);
          __k = __k + 1;
        } while (__k != pbVar1);
      }
      return;
    }
  }
  pcVar3 = AddGeneratedSource(this,&filename->Default,genVars,prepend);
  handleSkipPch(this,pcVar3);
  return;
}

Assistant:

void cmQtAutoGenInitializer::AddGeneratedSource(ConfigString const& filename,
                                                GenVarsT const& genVars,
                                                bool prepend)
{
  // XXX(xcode-per-cfg-src): Drop the Xcode-specific part of the condition
  // when the Xcode generator supports per-config sources.
  if (!this->MultiConfig || this->GlobalGen->IsXcode()) {
    cmSourceFile* sf =
      this->AddGeneratedSource(filename.Default, genVars, prepend);
    handleSkipPch(sf);
    return;
  }
  for (auto const& cfg : this->ConfigsList) {
    std::string const& filenameCfg = filename.Config.at(cfg);
    // Register source at makefile
    cmSourceFile* sf = this->RegisterGeneratedSource(filenameCfg);
    handleSkipPch(sf);
    // Add source file to target for this configuration.
    this->GenTarget->AddSource(
      cmStrCat("$<$<CONFIG:"_s, cfg, ">:"_s, filenameCfg, ">"_s), prepend);
    // Add source file to source group
    this->AddToSourceGroup(filenameCfg, genVars.GenNameUpper);
  }
}